

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

void cmd_copy(command_conflict *dest,command_conflict *src)

{
  char *pcVar1;
  long lVar2;
  
  memcpy(dest,src,0xb0);
  for (lVar2 = 0x18; lVar2 != 0xb8; lVar2 = lVar2 + 0x28) {
    if (*(int *)(dest->arg[0].name + lVar2 + -0x28) == 1) {
      pcVar1 = string_make(*(char **)(src->arg[0].name + lVar2 + -0x20));
      *(char **)(dest->arg[0].name + lVar2 + -0x20) = pcVar1;
    }
  }
  return;
}

Assistant:

void cmd_copy(struct command *dest, const struct command *src)
{
	int i;

	*dest = *src;
	/* String arguments require a deep copy. */
	for (i = 0; i < CMD_MAX_ARGS; ++i) {
		if (dest->arg[i].type == arg_STRING) {
			dest->arg[i].data.string =
				string_make(src->arg[i].data.string);
		}
	}
}